

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceDefinition::Node::~Node(Node *this)

{
  this->_vptr_Node = (_func_int **)&PTR__Node_01e537b8;
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&this->m_enclosingNode);
  return;
}

Assistant:

virtual					~Node				(void) { }